

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1Cachesize(sqlite3_pcache *p,int nMax)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  
  if (*(int *)(p + 0x1c) != 0) {
    lVar1 = *(long *)p;
    uVar3 = (*(int *)(p + 0x24) - *(int *)(lVar1 + 8)) + 0x7fff0000;
    if ((uint)nMax <= uVar3) {
      uVar3 = nMax;
    }
    iVar2 = (uVar3 - *(int *)(p + 0x24)) + *(int *)(lVar1 + 8);
    *(int *)(lVar1 + 8) = iVar2;
    *(int *)(lVar1 + 0x10) = (iVar2 - *(int *)(lVar1 + 0xc)) + 10;
    *(uint *)(p + 0x24) = uVar3;
    *(uint *)(p + 0x28) = (uVar3 * 9) / 10;
    pcache1EnforceMaxPage((PCache1 *)p);
    return;
  }
  return;
}

Assistant:

static void pcache1Cachesize(sqlite3_pcache *p, int nMax){
  PCache1 *pCache = (PCache1 *)p;
  u32 n;
  assert( nMax>=0 );
  if( pCache->bPurgeable ){
    PGroup *pGroup = pCache->pGroup;
    pcache1EnterMutex(pGroup);
    n = (u32)nMax;
    if( n > 0x7fff0000 - pGroup->nMaxPage + pCache->nMax ){
      n = 0x7fff0000 - pGroup->nMaxPage + pCache->nMax;
    }
    pGroup->nMaxPage += (n - pCache->nMax);
    pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
    pCache->nMax = n;
    pCache->n90pct = pCache->nMax*9/10;
    pcache1EnforceMaxPage(pCache);
    pcache1LeaveMutex(pGroup);
  }
}